

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DetonationPdu.cpp
# Opt level: O0

int __thiscall DIS::DetonationPdu::getMarshalledSize(DetonationPdu *this)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  size_type sVar9;
  const_reference pvVar10;
  undefined1 local_40 [8];
  VariableParameter listElement;
  unsigned_long_long idx;
  int marshalSize;
  DetonationPdu *this_local;
  
  iVar2 = WarfareFamilyPdu::getMarshalledSize(&this->super_WarfareFamilyPdu);
  iVar3 = EntityID::getMarshalledSize(&this->_explodingEntityID);
  iVar4 = EventIdentifier::getMarshalledSize(&this->_eventID);
  iVar5 = Vector3Float::getMarshalledSize(&this->_velocity);
  iVar6 = Vector3Double::getMarshalledSize(&this->_locationInWorldCoordinates);
  iVar7 = MunitionDescriptor::getMarshalledSize(&this->_descriptor);
  iVar8 = Vector3Float::getMarshalledSize(&this->_locationOfEntityCoordinates);
  idx._4_4_ = iVar2 + iVar3 + iVar4 + iVar5 + iVar6 + iVar7 + iVar8 + 4;
  listElement._variableParameterFields2 = 0;
  listElement._variableParameterFields3 = 0;
  listElement._variableParameterFields4 = '\0';
  listElement._31_1_ = 0;
  while( true ) {
    uVar1 = listElement._24_8_;
    sVar9 = std::vector<DIS::VariableParameter,_std::allocator<DIS::VariableParameter>_>::size
                      (&this->_variableParameters);
    if (sVar9 <= (ulong)uVar1) break;
    pvVar10 = std::vector<DIS::VariableParameter,_std::allocator<DIS::VariableParameter>_>::
              operator[](&this->_variableParameters,listElement._24_8_);
    VariableParameter::VariableParameter((VariableParameter *)local_40,pvVar10);
    iVar2 = VariableParameter::getMarshalledSize((VariableParameter *)local_40);
    idx._4_4_ = idx._4_4_ + iVar2;
    VariableParameter::~VariableParameter((VariableParameter *)local_40);
    listElement._24_8_ = listElement._24_8_ + 1;
  }
  return idx._4_4_;
}

Assistant:

int DetonationPdu::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = WarfareFamilyPdu::getMarshalledSize();
   marshalSize = marshalSize + _explodingEntityID.getMarshalledSize();  // _explodingEntityID
   marshalSize = marshalSize + _eventID.getMarshalledSize();  // _eventID
   marshalSize = marshalSize + _velocity.getMarshalledSize();  // _velocity
   marshalSize = marshalSize + _locationInWorldCoordinates.getMarshalledSize();  // _locationInWorldCoordinates
   marshalSize = marshalSize + _descriptor.getMarshalledSize();  // _descriptor
   marshalSize = marshalSize + _locationOfEntityCoordinates.getMarshalledSize();  // _locationOfEntityCoordinates
   marshalSize = marshalSize + 1;  // _detonationResult
   marshalSize = marshalSize + 1;  // _numberOfVariableParameters
   marshalSize = marshalSize + 2;  // _pad

   for(unsigned long long idx=0; idx < _variableParameters.size(); idx++)
   {
        VariableParameter listElement = _variableParameters[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }

    return marshalSize;
}